

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceTest_GenCodeMapReflectionMissingKeyDeathTest_Test::
~NoFieldPresenceTest_GenCodeMapReflectionMissingKeyDeathTest_Test
          (NoFieldPresenceTest_GenCodeMapReflectionMissingKeyDeathTest_Test *this)

{
  NoFieldPresenceTest_GenCodeMapReflectionMissingKeyDeathTest_Test *this_local;
  
  ~NoFieldPresenceTest_GenCodeMapReflectionMissingKeyDeathTest_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, GenCodeMapReflectionMissingKeyDeathTest) {
  TestAllMapTypes message;
  const Reflection* r = message.GetReflection();
  const Descriptor* desc = message.GetDescriptor();

  const FieldDescriptor* field_map_int32_bytes =
      desc->FindFieldByName("map_int32_bytes");

  // Trying to get an unset map entry would crash with a DCHECK in debug mode.
  EXPECT_DEATH(r->GetRepeatedMessage(message, field_map_int32_bytes, 0),
               "index < current_size_");
}